

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

void __thiscall
QTransposeProxyModel::setSourceModel(QTransposeProxyModel *this,QAbstractItemModel *newSourceModel)

{
  initializer_list<QMetaObject::Connection> args;
  bool bVar1;
  parameter_type pQVar2;
  const_iterator o;
  ContextType *context;
  parameter_type in_RSI;
  long in_FS_OFFSET;
  Connection *discIter;
  add_const_t<QList<QMetaObject::Connection>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QTransposeProxyModelPrivate *d;
  ulong in_stack_fffffffffffffa38;
  _Placeholder<3> *p_Var3;
  ulong uVar4;
  QList<QMetaObject::Connection> *pQVar5;
  _Placeholder<2> *in_stack_fffffffffffffa40;
  _Placeholder<2> *p_Var6;
  _Placeholder<1> *in_stack_fffffffffffffa48;
  _Placeholder<2> *in_stack_fffffffffffffa50;
  _Placeholder<1> *in_stack_fffffffffffffa58;
  QTransposeProxyModelPrivate **in_stack_fffffffffffffa60;
  QList<QMetaObject::Connection> *in_stack_fffffffffffffa68;
  iterator in_stack_fffffffffffffa70;
  size_type in_stack_fffffffffffffa78;
  _Placeholder<4> *in_stack_fffffffffffffa80;
  _Placeholder<5> *p_Var7;
  _Placeholder<5> *in_stack_fffffffffffffa88;
  _Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>
  *in_stack_fffffffffffffa90;
  _Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>
  *slot;
  ContextType *in_stack_fffffffffffffa98;
  QAbstractProxyModel *in_stack_fffffffffffffaa0;
  Object *sender;
  offset_in_QAbstractItemModel_to_subr in_stack_fffffffffffffab0;
  undefined1 *signal;
  offset_in_QAbstractItemModel_to_subr in_stack_fffffffffffffac0;
  undefined1 *signal_00;
  ConnectionType CVar8;
  undefined8 in_stack_fffffffffffffad0;
  ConnectionType CVar9;
  undefined8 in_stack_fffffffffffffae0;
  const_iterator local_a8;
  QTransposeProxyModelPrivate *local_a0;
  _Placeholder<5> local_98 [96];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = d_func((QTransposeProxyModel *)0x8b2161);
  pQVar2 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b218d);
  if (in_RSI != pQVar2) {
    QAbstractItemModel::beginResetModel((QAbstractItemModel *)in_stack_fffffffffffffa88);
    pQVar2 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                       ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                         *)0x8b21c3);
    CVar8 = (ConnectionType)in_stack_fffffffffffffad0;
    CVar9 = (ConnectionType)in_stack_fffffffffffffae0;
    if (pQVar2 != (parameter_type)0x0) {
      local_a8.i = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = QList<QMetaObject::Connection>::begin
                           ((QList<QMetaObject::Connection> *)in_stack_fffffffffffffa40);
      o = QList<QMetaObject::Connection>::end
                    ((QList<QMetaObject::Connection> *)in_stack_fffffffffffffa40);
      while( true ) {
        bVar1 = QList<QMetaObject::Connection>::const_iterator::operator!=(&local_a8,o);
        CVar8 = (ConnectionType)in_stack_fffffffffffffad0;
        CVar9 = (ConnectionType)in_stack_fffffffffffffae0;
        if (!bVar1) break;
        QList<QMetaObject::Connection>::const_iterator::operator*(&local_a8);
        QObject::disconnect((Connection *)in_stack_fffffffffffffa48);
        QList<QMetaObject::Connection>::const_iterator::operator++(&local_a8);
      }
    }
    QList<QMetaObject::Connection>::clear
              ((QList<QMetaObject::Connection> *)in_stack_fffffffffffffa40);
    QAbstractProxyModel::setSourceModel
              (in_stack_fffffffffffffaa0,(QAbstractItemModel *)in_stack_fffffffffffffa98);
    pQVar2 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                       ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                         *)0x8b22ea);
    if (pQVar2 != (parameter_type)0x0) {
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2318);
      in_stack_fffffffffffffa38 = in_stack_fffffffffffffa38 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar8);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b23c4);
      p_Var3 = (_Placeholder<3> *)(in_stack_fffffffffffffa38 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar8);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2470);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,in_stack_fffffffffffffa40,p_Var3);
      p_Var3 = (_Placeholder<3> *)((ulong)p_Var3 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&)>
                  *)in_stack_fffffffffffffa90,CVar9);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2550);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(Qt::Orientation,int,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,in_stack_fffffffffffffa40,p_Var3);
      p_Var3 = (_Placeholder<3> *)((ulong)p_Var3 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(Qt::Orientation,int,int),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(Qt::Orientation,int,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(Qt::Orientation,_int,_int)>
                  *)in_stack_fffffffffffffa90,CVar9);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2630);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,int,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,in_stack_fffffffffffffa40,p_Var3);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)in_stack_fffffffffffffa90,CVar9);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2710);
      p_Var6 = (_Placeholder<2> *)&std::placeholders::_5;
      uVar4 = 0;
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&,std::_Placeholder<5>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa68,
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                 (_Placeholder<3> *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa88);
      p_Var3 = (_Placeholder<3> *)(uVar4 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(QModelIndex_const&,int,int,QModelIndex_const&,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,CVar9);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2808);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,int,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,p_Var6,p_Var3);
      uVar4 = (ulong)p_Var3 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)in_stack_fffffffffffffa90,CVar9);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b28e8);
      uVar4 = uVar4 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar8);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2994);
      uVar4 = uVar4 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar8);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2a40);
      p_Var3 = (_Placeholder<3> *)(uVar4 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar8);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2aec);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,int,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,p_Var6,p_Var3);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)in_stack_fffffffffffffa90,CVar9);
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2bcc);
      p_Var6 = (_Placeholder<2> *)&std::placeholders::_5;
      uVar4 = 0;
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,int,int,QModelIndex_const&,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&,std::_Placeholder<5>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa68,
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                 (_Placeholder<3> *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa88);
      p_Var3 = (_Placeholder<3> *)(uVar4 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(QModelIndex_const&,int,int,QModelIndex_const&,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,CVar9);
      CVar8 = (ConnectionType)local_38;
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2cc4);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QModelIndex_const&,int,int),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,p_Var6,p_Var3);
      uVar4 = (ulong)p_Var3 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                (&in_stack_fffffffffffffaa0->super_QAbstractItemModel,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)in_stack_fffffffffffffa90,CVar8);
      CVar9 = (ConnectionType)local_30;
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2da4);
      uVar4 = uVar4 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar9);
      signal_00 = local_28;
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2e50);
      uVar4 = uVar4 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,in_stack_fffffffffffffab0,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar9);
      signal = local_20;
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2ef9);
      uVar4 = uVar4 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)in_stack_fffffffffffffa90,(offset_in_QAbstractItemModel_to_subr)signal,
                 (ContextType *)in_stack_fffffffffffffa88,
                 (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffa80,CVar9);
      sender = (Object *)local_18;
      ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                  *)0x8b2f9f);
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,p_Var6);
      uVar4 = uVar4 & 0xffffffff00000000;
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>))(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>>
                (sender,(offset_in_QAbstractItemModel_to_subr)signal_00,in_stack_fffffffffffffa98,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>
                  *)in_stack_fffffffffffffa90,CVar8);
      slot = (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>
              *)(local_18 + 8);
      context = &::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                           ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                             *)0x8b306c)->super_QObject;
      std::
      bind<void(QTransposeProxyModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),QTransposeProxyModelPrivate*const&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((offset_in_QTransposeProxyModelPrivate_to_subr *)in_stack_fffffffffffffa58,
                 (QTransposeProxyModelPrivate **)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                 ,p_Var6);
      pQVar5 = (QList<QMetaObject::Connection> *)(uVar4 & 0xffffffff00000000);
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>))(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>>
                (sender,(offset_in_QAbstractItemModel_to_subr)signal_00,context,slot,CVar8);
      args._M_len = in_stack_fffffffffffffa78;
      args._M_array = in_stack_fffffffffffffa70;
      QList<QMetaObject::Connection>::QList(in_stack_fffffffffffffa68,args);
      QList<QMetaObject::Connection>::operator=((QList<QMetaObject::Connection> *)p_Var6,pQVar5);
      QList<QMetaObject::Connection>::~QList((QList<QMetaObject::Connection> *)0x8b3174);
      p_Var7 = local_98;
      in_stack_fffffffffffffa88 = (_Placeholder<5> *)&local_8;
      do {
        in_stack_fffffffffffffa88 = in_stack_fffffffffffffa88 + -8;
        QMetaObject::Connection::~Connection((Connection *)p_Var6);
      } while (in_stack_fffffffffffffa88 != p_Var7);
    }
    QAbstractItemModel::endResetModel((QAbstractItemModel *)in_stack_fffffffffffffa88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTransposeProxyModel::setSourceModel(QAbstractItemModel* newSourceModel)
{
    Q_D(QTransposeProxyModel);
    if (newSourceModel == d->model)
        return;
    beginResetModel();
    if (d->model) {
        for (const QMetaObject::Connection& discIter : std::as_const(d->sourceConnections))
            disconnect(discIter);
    }
    d->sourceConnections.clear();
    QAbstractProxyModel::setSourceModel(newSourceModel);
    if (d->model) {
        using namespace std::placeholders;
        d->sourceConnections = QList<QMetaObject::Connection>{
            connect(d->model, &QAbstractItemModel::modelAboutToBeReset, this, &QTransposeProxyModel::beginResetModel),
            connect(d->model, &QAbstractItemModel::modelReset, this, &QTransposeProxyModel::endResetModel),
            connect(d->model, &QAbstractItemModel::dataChanged, this, std::bind(&QTransposeProxyModelPrivate::onDataChanged, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::headerDataChanged, this, std::bind(&QTransposeProxyModelPrivate::onHeaderDataChanged, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeInserted, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeInserted, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeMoved, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeMoved, d, _1, _2, _3, _4, _5)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeRemoved, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeRemoved, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsInserted, this, &QTransposeProxyModel::endInsertRows),
            connect(d->model, &QAbstractItemModel::columnsRemoved, this, &QTransposeProxyModel::endRemoveRows),
            connect(d->model, &QAbstractItemModel::columnsMoved, this, &QTransposeProxyModel::endMoveRows),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeInserted, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeInserted, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeMoved, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeMoved, d, _1, _2, _3, _4, _5)),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeRemoved, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeRemoved, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::rowsInserted, this, &QTransposeProxyModel::endInsertColumns),
            connect(d->model, &QAbstractItemModel::rowsRemoved, this, &QTransposeProxyModel::endRemoveColumns),
            connect(d->model, &QAbstractItemModel::rowsMoved, this, &QTransposeProxyModel::endMoveColumns),
            connect(d->model, &QAbstractItemModel::layoutAboutToBeChanged, this, std::bind(&QTransposeProxyModelPrivate::onLayoutAboutToBeChanged, d, _1, _2)),
            connect(d->model, &QAbstractItemModel::layoutChanged, this, std::bind(&QTransposeProxyModelPrivate::onLayoutChanged, d, _1, _2))
        };
    }
    endResetModel();
}